

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

_Bool imap_matchresp(char *line,size_t len,char *cmd)

{
  byte *pbVar1;
  long lVar2;
  int iVar3;
  size_t max;
  ushort **ppuVar4;
  byte *pbVar5;
  long lVar6;
  byte *pbVar7;
  
  pbVar1 = (byte *)(line + len);
  max = strlen(cmd);
  pbVar7 = (byte *)(line + 2);
  if (2 < (long)len) {
    ppuVar4 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar7 * 2 + 1) & 8) != 0) {
      pbVar7 = (byte *)(line + 3);
      lVar2 = 0;
      do {
        lVar6 = lVar2;
        pbVar5 = pbVar7;
        if (pbVar1 <= pbVar5) break;
        pbVar7 = pbVar5 + 1;
        lVar2 = lVar6 + -1;
      } while ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar5 * 2 + 1) & 8) != 0);
      if (3 - len == lVar6) {
        return false;
      }
      if (*pbVar5 != 0x20) {
        return false;
      }
      pbVar7 = (byte *)(line + (4 - lVar6));
    }
  }
  pbVar5 = pbVar7 + max;
  if (((pbVar5 <= pbVar1) && (iVar3 = Curl_strncasecompare((char *)pbVar7,cmd,max), iVar3 != 0)) &&
     (pbVar5 + 2 == pbVar1 || *pbVar5 == 0x20)) {
    return true;
  }
  return false;
}

Assistant:

static bool imap_matchresp(const char *line, size_t len, const char *cmd)
{
  const char *end = line + len;
  size_t cmd_len = strlen(cmd);

  /* Skip the untagged response marker */
  line += 2;

  /* Do we have a number after the marker? */
  if(line < end && ISDIGIT(*line)) {
    /* Skip the number */
    do
      line++;
    while(line < end && ISDIGIT(*line));

    /* Do we have the space character? */
    if(line == end || *line != ' ')
      return FALSE;

    line++;
  }

  /* Does the command name match and is it followed by a space character or at
     the end of line? */
  if(line + cmd_len <= end && strncasecompare(line, cmd, cmd_len) &&
     (line[cmd_len] == ' ' || line + cmd_len + 2 == end))
    return TRUE;

  return FALSE;
}